

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O3

void __thiscall
QStyleOptionComboBox::QStyleOptionComboBox(QStyleOptionComboBox *this,QStyleOptionComboBox *other)

{
  QStyleOptionComplex::QStyleOptionComplex(&this->super_QStyleOptionComplex,1,0xf0004);
  (this->popupRect).x1 = 0;
  (this->popupRect).y1 = 0;
  (this->popupRect).x2 = -1;
  (this->popupRect).y2 = -1;
  (this->currentText).d.d = (Data *)0x0;
  (this->currentText).d.ptr = (char16_t *)0x0;
  (this->currentText).d.size = 0;
  QIcon::QIcon(&this->currentIcon);
  (this->iconSize).wd = -1;
  (this->iconSize).ht = -1;
  (this->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x81;
  operator=(this,other);
  return;
}

Assistant:

QStyleOptionComboBox(const QStyleOptionComboBox &other) : QStyleOptionComplex(Version, Type) { *this = other; }